

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
AddCleared(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  Rep *pRVar1;
  int iVar2;
  
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  if (pRVar1 == (Rep *)0x0) {
    iVar2 = (this->super_RepeatedPtrFieldBase).total_size_;
  }
  else {
    iVar2 = pRVar1->allocated_size;
    if (iVar2 != (this->super_RepeatedPtrFieldBase).total_size_) goto LAB_00261059;
  }
  internal::RepeatedPtrFieldBase::Reserve(&this->super_RepeatedPtrFieldBase,iVar2 + 1);
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  iVar2 = pRVar1->allocated_size;
LAB_00261059:
  pRVar1->allocated_size = iVar2 + 1;
  pRVar1->elements[iVar2] = value;
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::AddCleared(Element* value) {
  return RepeatedPtrFieldBase::AddCleared<TypeHandler>(value);
}